

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManDupHashMapping(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x929,"Gia_Man_t *Gia_ManDupHashMapping(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar17];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_006f205b;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_006f2099:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_006f2099;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCis;
    } while (lVar17 < pVVar9->nSize);
  }
  if (0 < p->nObjs) {
    lVar18 = 8;
    lVar17 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)((long)pGVar2 + lVar18 + -8);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        uVar12 = *(uint *)((long)pGVar2 +
                          lVar18 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar16 = *(uint *)((long)pGVar2 +
                              lVar18 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar16 < 0)) goto LAB_006f20b8;
        iVar5 = Gia_ManHashAnd(p_00,uVar12 ^ (uint)(uVar3 >> 0x1d) & 1,
                               uVar16 ^ (uint)(uVar3 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar18) = iVar5;
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar17 < p->nObjs);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar17];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_006f205b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar5;
      uVar16 = (uint)*(undefined8 *)pGVar2;
      uVar12 = pGVar2[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) {
LAB_006f20b8:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar12);
      lVar17 = lVar17 + 1;
      pVVar9 = p->vCos;
    } while (lVar17 < pVVar9->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar5 = p->vMapping->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar14 = iVar5;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar14;
  if (iVar14 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar9->pArray = piVar10;
  uVar12 = p->nObjs;
  if (iVar14 < (int)uVar12) {
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar12 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar12 << 2);
    }
    pVVar9->pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar9->nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset(pVVar9->pArray,0,(ulong)uVar12 * 4);
  }
  pVVar9->nSize = uVar12;
  if (1 < p->nObjs) {
    lVar17 = 1;
    do {
      pVVar11 = p->vMapping;
      if (pVVar11->nSize <= lVar17) goto LAB_006f203c;
      piVar10 = pVVar11->pArray;
      if (piVar10[lVar17] != 0) {
        pGVar2 = p->pObjs;
        uVar12 = pGVar2[lVar17].Value;
        if ((int)uVar12 < 0) {
LAB_006f207a:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar12 = uVar12 >> 1;
        if (pVVar9->nSize <= (int)uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar9->pArray[uVar12] = pVVar9->nSize;
        if (pVVar11->nSize <= lVar17) {
LAB_006f203c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = piVar10[lVar17];
        if (((long)iVar5 < 0) || (pVVar11->nSize <= iVar5)) goto LAB_006f203c;
        Vec_IntPush(pVVar9,piVar10[iVar5]);
        pVVar11 = p->vMapping;
        lVar18 = (long)pVVar11->nSize;
        if (lVar18 <= lVar17) goto LAB_006f203c;
        lVar15 = 0;
        while( true ) {
          piVar10 = pVVar11->pArray;
          lVar13 = (long)piVar10[lVar17];
          if ((lVar13 < 0) || ((int)lVar18 <= piVar10[lVar17])) goto LAB_006f203c;
          if (piVar10[lVar13] <= lVar15) break;
          iVar5 = piVar10[lVar13 + lVar15 + 1];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_006f205b;
          uVar12 = p->pObjs[iVar5].Value;
          if ((int)uVar12 < 0) goto LAB_006f207a;
          Vec_IntPush(pVVar9,uVar12 >> 1);
          lVar15 = lVar15 + 1;
          pVVar11 = p->vMapping;
          lVar18 = (long)pVVar11->nSize;
          if (lVar18 <= lVar17) goto LAB_006f203c;
        }
        uVar12 = pGVar2[lVar17].Value;
        if ((int)uVar12 < 0) goto LAB_006f207a;
        Vec_IntPush(pVVar9,uVar12 >> 1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nObjs);
  }
  p_00->vMapping = pVVar9;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHashMapping( Gia_Man_t * p )
{
    Gia_Man_t * pNew; 
    Vec_Int_t * vMapping; 
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Gia_ManHasMapping(p) );
    // copy the old manager with hashing
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // recreate mapping
    vMapping = Vec_IntAlloc( Vec_IntSize(p->vMapping) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( p, i )
    {
        pObj = Gia_ManObj( p, i );
        Vec_IntWriteEntry( vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFaninObj( p, i, pFanin, k )
            Vec_IntPush( vMapping, Abc_Lit2Var(pFanin->Value)  );
        Vec_IntPush( vMapping, Abc_Lit2Var(pObj->Value) );
    }
    pNew->vMapping = vMapping;
    return pNew;
}